

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O0

WebData AllocUserData(SUNContext ctx)

{
  WebData paVar1;
  sunrealtype **ppsVar2;
  sunindextype *psVar3;
  N_Vector p_Var4;
  undefined8 in_RDI;
  WebData wdata;
  sunindextype ns;
  int ngrp;
  int i;
  int local_c;
  
  paVar1 = (WebData)malloc(0x990);
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    ppsVar2 = (sunrealtype **)SUNDlsMat_newDenseMat(6,6);
    paVar1->P[local_c] = ppsVar2;
    psVar3 = (sunindextype *)SUNDlsMat_newIndexArray(6);
    paVar1->pivot[local_c] = psVar3;
  }
  p_Var4 = (N_Vector)N_VNew_Serial(0xd8,in_RDI);
  paVar1->rewt = p_Var4;
  p_Var4 = (N_Vector)N_VNew_Serial(0xd8,in_RDI);
  paVar1->tmp = p_Var4;
  return paVar1;
}

Assistant:

static WebData AllocUserData(SUNContext ctx)
{
  int i, ngrp = NGRP;
  sunindextype ns = NS;
  WebData wdata;

  wdata = (WebData)malloc(sizeof *wdata);
  for (i = 0; i < ngrp; i++)
  {
    (wdata->P)[i]     = SUNDlsMat_newDenseMat(ns, ns);
    (wdata->pivot)[i] = SUNDlsMat_newIndexArray(ns);
  }
  wdata->rewt = N_VNew_Serial(NEQ, ctx);
  wdata->tmp  = N_VNew_Serial(NEQ, ctx);
  return (wdata);
}